

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O2

void pp_tree_avl_rotate_left(PTreeAVLNode *node,PTreeBaseNode **root)

{
  uint uVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeAVLNode_ *pPVar3;
  PTreeAVLNode_ *pPVar4;
  
  pPVar2 = (node->base).left;
  pPVar4 = node->parent;
  (pPVar4->base).right = pPVar2;
  if (pPVar2 != (PTreeBaseNode_ *)0x0) {
    pPVar2[1].left = &pPVar4->base;
    pPVar4 = node->parent;
  }
  (node->base).left = &pPVar4->base;
  node->parent = pPVar4->parent;
  pPVar4->parent = node;
  pPVar3 = node->parent;
  if (pPVar3 != (PTreeAVLNode_ *)0x0) {
    root = &(pPVar3->base).left + ((PTreeAVLNode_ *)(pPVar3->base).left != pPVar4);
  }
  *root = &node->base;
  uVar1 = node->balance_factor;
  node->balance_factor = uVar1 + 1;
  *(uint *)&(node->base).left[1].right = ~uVar1;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_left (PTreeAVLNode *node, PTreeBaseNode **root)
{
	node->parent->base.right = node->base.left;

	if (node->base.left != NULL)
		((PTreeAVLNode *) node->base.left)->parent = (PTreeAVLNode *) node->parent;

	node->base.left = (PTreeBaseNode *) node->parent;
	node->parent = ((PTreeAVLNode *) node->base.left)->parent;
	((PTreeAVLNode *) node->base.left)->parent = node;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == node->base.left)
			node->parent->base.left = (PTreeBaseNode *) node;
		else
			node->parent->base.right = (PTreeBaseNode *) node;
	} else
		*root = (PTreeBaseNode *) node;

	/* Restore balance factor */
	((PTreeAVLNode *) node)->balance_factor +=1;
	((PTreeAVLNode *) node->base.left)->balance_factor = -((PTreeAVLNode *) node)->balance_factor;
}